

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Appearance_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Appearance_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_390;
  KString local_370;
  KString local_350;
  KString local_330;
  KString local_310;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Appearance_PDU *local_18;
  Appearance_PDU *this_local;
  
  local_18 = this;
  this_local = (Appearance_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  LE_Header::GetAsString_abi_cxx11_(&local_1c0,&this->super_LE_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Appearance PDU-\n");
  poVar1 = std::operator<<(poVar1,"Optional Field Flags:\n");
  poVar1 = std::operator<<(poVar1,"\tForce ID:              ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((this->m_AppearanceFlag1Union).m_ui8Flag & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tEntity Type:           ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tAlternate Entity Type: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tEntity Marking:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tCapabilities:          ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 4 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tAppearance-Visual:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tAppearance-IR:         ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag1Union).m_ui8Flag >> 6 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tFlag2:                 ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(ushort)((this->m_AppearanceFlag1Union).m_ui8Flag >> 7));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tAppearance-EM:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_AppearanceFlag2Union).m_ui8Flag & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tAppearance-Audio:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
    poVar1 = std::operator<<(local_190,"\tAppearance-EM:         ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->m_AppearanceFlag2Union).m_ui8Flag & 1);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\tAppearance-Audio:      ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1);
    std::operator<<(poVar1,"\n");
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Force ID:          ");
    DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
              (&local_210,(ENUMS *)(ulong)this->m_ui8ForceID,Value_00);
    poVar1 = std::operator<<(poVar1,(string *)&local_210);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_210);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 1 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Entity Type:         ");
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_230,&this->m_EntityType);
    std::operator<<(poVar1,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Alternate Entity Type:         ");
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_250,&this->m_AltEntityType);
    std::operator<<(poVar1,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 3 & 1) != 0) {
    DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&local_270,&this->m_EntityMarking);
    std::operator<<(local_190,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 4 & 1) != 0) {
    DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_(&local_290,&this->m_EntityCapabilities);
    std::operator<<(local_190,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Appearance-Visual:\n");
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_2d0,&this->m_VisApp,&this->m_EntityType);
    UTILS::IndentString(&local_2b0,&local_2d0,1,'\t');
    std::operator<<(poVar1,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 6 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Appearance-IR:\n");
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_310,&this->m_IRApp,&this->m_EntityType);
    UTILS::IndentString(&local_2f0,&local_310,1,'\t');
    std::operator<<(poVar1,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
  }
  if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
    if (((this->m_AppearanceFlag2Union).m_ui8Flag & 1) != 0) {
      poVar1 = std::operator<<(local_190,"Appearance-EM:\n");
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_350,&this->m_EMApp,&this->m_EntityType);
      UTILS::IndentString(&local_330,&local_350,1,'\t');
      std::operator<<(poVar1,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
    }
    if (((this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1) != 0) {
      poVar1 = std::operator<<(local_190,"Appearance-Audio:\n");
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_390,&this->m_AudApp,&this->m_EntityType);
      UTILS::IndentString(&local_370,&local_390,1,'\t');
      std::operator<<(poVar1,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Appearance_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Appearance PDU-\n"
       << "Optional Field Flags:\n"
       << "\tForce ID:              " << GetEnumAsStringForceID( m_AppearanceFlag1Union.m_ui8ForceId ) << "\n"
       << "\tEntity Type:           " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Typ    << "\n"
       << "\tAlternate Entity Type: " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8AltTyp << "\n"
       << "\tEntity Marking:        " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Mark   << "\n"
       << "\tCapabilities:          " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Cap    << "\n"
       << "\tAppearance-Visual:     " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Vis    << "\n"
       << "\tAppearance-IR:         " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8IR     << "\n"
       << "\tFlag2:                 " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Flag2  << "\n"
       << "\tAppearance-EM:         " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8EM     << "\n"
       << "\tAppearance-Audio:      " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8Audio  << "\n";

    if (m_AppearanceFlag1Union.m_ui8Flag2)
    {
        ss << "\tAppearance-EM:         " << (KUINT16)m_AppearanceFlag2Union.m_ui8EM << "\n"
           << "\tAppearance-Audio:      " << (KUINT16)m_AppearanceFlag2Union.m_ui8Audio << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        ss << "Force ID:          " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        ss << "Entity Type:         " << m_EntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        ss << "Alternate Entity Type:         " << m_AltEntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        ss << m_EntityMarking.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        ss << m_EntityCapabilities.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        ss << "Appearance-Visual:\n" << IndentString( m_VisApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        ss << "Appearance-IR:\n" << IndentString( m_IRApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            ss << "Appearance-EM:\n" << IndentString( m_EMApp.GetAsString( m_EntityType ), 1 );
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            ss << "Appearance-Audio:\n" << IndentString( m_AudApp.GetAsString( m_EntityType ), 1 );
        }
    }

    return ss.str();
}